

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  SegmentId id;
  CapTableBuilder *capTable;
  int iVar3;
  SegmentBuilder *this_00;
  unsigned_long uVar4;
  SegmentBuilder *pSVar5;
  ulong uVar6;
  SegmentBuilder *pSVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  undefined8 *puVar11;
  ushort uVar12;
  OrphanBuilder *pOVar13;
  uint uVar14;
  WirePointer *pWVar15;
  WirePointer *pWVar16;
  ulong uVar17;
  ushort uVar18;
  word *pwVar19;
  BuilderArena *pBVar20;
  word *result_1;
  AllocateResult AVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  uint local_f8;
  ElementSize oldSize;
  BuilderArena *local_f0;
  uint local_e4;
  WirePointer *local_e0;
  WirePointer *local_d8;
  Iterator __end5;
  uint local_c8;
  WirePointer *local_c0;
  WirePointer *local_b8;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  uVar9 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar9 != 0) {
    pSVar7 = this->segment;
    capTable = this->capTable;
    pBVar20 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
    if ((uVar9 & 3) == 2) {
      local_f0 = pBVar20;
      this_00 = BuilderArena::getSegment(pBVar20,id);
      uVar9 = (uint)(this->tag).content;
      pwVar19 = (this_00->super_SegmentReader).ptr.ptr;
      uVar6 = (ulong)(uVar9 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar19->content + uVar6);
      pOVar13 = (OrphanBuilder *)((long)&pwVar19[1].content + uVar6);
      if ((uVar9 & 4) == 0) {
        local_e0 = (WirePointer *)(&pOVar13->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar13 = pOVar1;
        pBVar20 = local_f0;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        local_e0 = (WirePointer *)
                   ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
        pBVar20 = local_f0;
      }
    }
    else {
      local_e0 = (WirePointer *)this->location;
      pOVar13 = this;
      this_00 = pSVar7;
    }
    AVar23.words = &this->tag;
    AVar23.segment = pSVar7;
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(pOVar13->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      local_f8 = (uint)elementSize >> 0x10;
      uVar9 = *(uint *)((long)&(pOVar13->tag).content + 4);
      oldSize = (ElementSize)uVar9 & INLINE_COMPOSITE;
      uVar12 = elementSize.data;
      uVar18 = elementSize.pointers;
      if (oldSize == INLINE_COMPOSITE) {
        uVar9 = (uint)*(uint64_t *)&(local_e0->offsetAndKind).value;
        _kjCondition.result = (uVar9 & 3) == 0;
        _kjCondition._0_8_ = (ulong)uVar9 & 0xffffffff00000003;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if (_kjCondition.result) {
          local_b8 = local_e0 + 1;
          uVar2 = *(ushort *)&local_e0->field_1;
          uVar8 = *(ushort *)((long)&local_e0->field_1 + 2);
          local_c8 = (uint)uVar8 + (uint)uVar2;
          uVar14 = uVar9 >> 2 & 0x1fffffff;
          uVar6 = (ulong)uVar14;
          uVar9 = (uint)uVar2;
          if (uVar8 < uVar18 || uVar2 < uVar12) {
            uVar17 = (ulong)uVar9;
            if (uVar2 <= uVar12) {
              uVar17 = (ulong)(uint)elementSize;
            }
            if (uVar18 < uVar8) {
              local_f8 = (uint)uVar8;
            }
            local_e4 = (uint)uVar17 & 0xffff;
            uVar9 = local_f8 + local_e4;
            local_f0 = pBVar20;
            uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_1_>
                              (uVar6 * uVar9,(anon_class_1_0_00000001 *)&_kjCondition);
            if ((((this->tag).content & 3) == 2) &&
               (pSVar5 = BuilderArena::getSegment
                                   ((BuilderArena *)(pSVar7->super_SegmentReader).arena,
                                    (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
               pSVar5->readOnly == false)) {
              uVar14 = (uint)(this->tag).content;
              puVar11 = (undefined8 *)
                        ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                        (ulong)(uVar14 & 0xfffffff8));
              if ((uVar14 & 4) == 0) {
                *puVar11 = 0;
              }
              else {
                *puVar11 = 0;
                puVar11[1] = 0;
              }
            }
            (this->tag).content = 0;
            iVar10 = (int)uVar4;
            uVar14 = iVar10 + 1;
            pOVar13 = this;
            ___end5 = uVar6;
            if (local_f0 == (BuilderArena *)0x0) {
              pwVar19 = pSVar7->pos;
              AVar22.words = pwVar19;
              AVar22.segment = pSVar7;
              if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                         ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar19)) >> 3 <
                   (long)(ulong)uVar14) || (pSVar7->pos = pwVar19 + uVar14, pwVar19 == (word *)0x0))
              {
                pBVar20 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
                uVar14 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                   (iVar10 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
                uVar6 = ___end5;
                AVar23 = BuilderArena::allocate(pBVar20,uVar14);
                pOVar13 = (OrphanBuilder *)AVar23.words;
                pSVar7 = AVar23.segment;
                *(uint *)&(this->tag).content =
                     (int)AVar23.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr &
                     0xfffffff8U | 2;
                *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
                *(undefined4 *)&(pOVar13->tag).content = 1;
                AVar22.words = (word *)&pOVar13->segment;
                AVar22.segment = pSVar7;
              }
              else {
                *(uint *)&(this->tag).content =
                     ((uint)((ulong)((long)pwVar19 - (long)this) >> 1) & 0xfffffffc) - 3;
              }
            }
            else {
              AVar22 = BuilderArena::allocate(local_f0,uVar14);
              *(undefined4 *)&(this->tag).content = 0xfffffffd;
            }
            pwVar19 = AVar22.words;
            pSVar7 = AVar22.segment;
            *(int *)((long)&(pOVar13->tag).content + 4) = iVar10 * 8 + 7;
            *(int *)&pwVar19->content = (int)uVar6 * 4;
            *(short *)((long)&pwVar19->content + 4) = (short)uVar17;
            *(short *)((long)&pwVar19->content + 6) = (short)local_f8;
            local_c0 = (WirePointer *)(pwVar19 + (uVar17 & 0xffff) + 1);
            pWVar15 = (WirePointer *)(pwVar19 + 1);
            local_f0 = (BuilderArena *)(local_e0 + (ulong)uVar2 + 1);
            local_d8 = pWVar15;
            for (iVar10 = 0; pWVar16 = local_e0, iVar10 != (int)uVar6; iVar10 = iVar10 + 1) {
              pWVar16 = local_c0;
              uVar6 = (ulong)uVar8;
              pBVar20 = local_f0;
              if (uVar2 != 0) {
                memcpy(local_d8,local_b8,(ulong)uVar2 * 8);
                pBVar20 = local_f0;
              }
              while (uVar6 != 0) {
                WireHelpers::transferPointer(pSVar7,pWVar16,this_00,(WirePointer *)pBVar20);
                pWVar16 = pWVar16 + 1;
                uVar6 = uVar6 - 1;
                pBVar20 = (BuilderArena *)((long)pBVar20 + 8);
              }
              local_d8 = local_d8 + uVar9;
              local_b8 = local_b8 + local_c8;
              local_c0 = (WirePointer *)
                         ((long)&(local_c0->offsetAndKind).value + (ulong)(uVar9 * 8));
              local_f0 = (BuilderArena *)
                         ((long)&((WireValue<uint32_t> *)&local_f0->super_Arena)->value +
                         (ulong)(local_c8 * 8));
              uVar6 = ___end5;
            }
            uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_2_>
                              (local_c8 * uVar6,(anon_class_1_0_00000001 *)&_kjCondition);
            iVar10 = (int)uVar4 + 1;
            local_b8 = pWVar15;
            local_c8 = uVar9;
            if (iVar10 != 0) {
              memset(pWVar16,0,(ulong)(uint)(iVar10 * 8));
            }
LAB_0015128a:
            uVar14 = (uint)uVar6;
            this_00 = pSVar7;
            uVar9 = local_e4;
            uVar8 = (ushort)local_f8;
          }
LAB_00151297:
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = capTable;
          __return_storage_ptr__->ptr = (byte *)local_b8;
          __return_storage_ptr__->elementCount = uVar14;
          __return_storage_ptr__->step = local_c8 << 6;
          __return_storage_ptr__->structDataSize = uVar9 << 6;
          __return_storage_ptr__->structPointerCount = uVar8;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
          goto LAB_00150aea;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   &_kjCondition,
                   (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      }
      else {
        ___end5 = (ulong)(uVar9 >> 3);
        if ((uVar9 & 7) == 0) {
          uVar9 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                            (uVar9 >> 3,(anon_class_1_0_00000001 *)&_kjCondition);
          ___end5 = (ulong)uVar9;
          uVar9 = (uint)elementSize & 0xffff;
          local_c8 = local_f8 + uVar9;
          uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                            (local_c8 * ___end5,(anon_class_1_0_00000001 *)&_kjCondition);
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)this);
          }
          pwVar19 = pSVar7->pos;
          uVar6 = uVar4 + 1 & 0xffffffff;
          if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                     ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar19)) >> 3 <
               (long)uVar6) || (pSVar7->pos = pwVar19 + uVar6, pwVar19 == (word *)0x0)) {
            pBVar20 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
            uVar14 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                               ((int)uVar4 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
            AVar23 = BuilderArena::allocate(pBVar20,uVar14);
            *(uint *)&(this->tag).content =
                 (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)&(this->tag).content + 4) =
                 ((AVar23.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar23.words)->content = 1;
            pwVar19 = AVar23.words + 1;
          }
          else {
            *(uint *)&(this->tag).content =
                 ((uint)((ulong)((long)pwVar19 - (long)this) >> 1) & 0xfffffffc) - 3;
          }
          this_00 = AVar23.segment;
          *(int *)((long)&(AVar23.words)->content + 4) = (int)uVar4 * 8 + 7;
          uVar14 = (uint)___end5;
          *(uint *)&pwVar19->content = uVar14 << 2;
          *(ushort *)((long)&pwVar19->content + 4) = uVar12;
          *(ushort *)((long)&pwVar19->content + 6) = uVar18;
          local_b8 = (WirePointer *)(pwVar19 + 1);
          uVar8 = uVar18;
          goto LAB_00151297;
        }
        uVar14 = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar9 & 7) * 4);
        _kjCondition._0_8_ = &oldSize;
        _kjCondition.op.content.ptr = "";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_1f341;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize != BIT) {
          if (oldSize == POINTER) {
            local_f8 = local_f8 + (local_f8 == 0);
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          local_d8 = (WirePointer *)CONCAT44(local_d8._4_4_,(uint)(oldSize == POINTER));
          local_e4 = (uint)elementSize & 0xffff;
          local_c8 = (local_f8 & 0xffff) + local_e4;
          local_f0 = (BuilderArena *)((ulong)uVar9 & 7);
          uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_3_>
                            (local_c8 * ___end5,(anon_class_1_0_00000001 *)&_kjCondition);
          if ((((this->tag).content & 3) == 2) &&
             (pSVar5 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar7->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar5->readOnly == false)) {
            uVar9 = (uint)(this->tag).content;
            puVar11 = (undefined8 *)
                      ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar9 & 0xfffffff8));
            if ((uVar9 & 4) == 0) {
              *puVar11 = 0;
            }
            else {
              *puVar11 = 0;
              puVar11[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar10 = (int)local_d8 << 6;
          iVar3 = (int)uVar4;
          uVar9 = iVar3 + 1;
          pOVar13 = this;
          local_d8._0_4_ = iVar10;
          if (pBVar20 == (BuilderArena *)0x0) {
            pwVar19 = pSVar7->pos;
            AVar21.words = pwVar19;
            AVar21.segment = pSVar7;
            if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                       ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar19)) >> 3 <
                 (long)(ulong)uVar9) || (pSVar7->pos = pwVar19 + uVar9, pwVar19 == (word *)0x0)) {
              pBVar20 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
              uVar9 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                (iVar3 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
              AVar23 = BuilderArena::allocate(pBVar20,uVar9);
              pOVar13 = (OrphanBuilder *)AVar23.words;
              pSVar7 = AVar23.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar23.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar13->tag).content = 1;
              AVar21.words = (word *)&pOVar13->segment;
              AVar21.segment = pSVar7;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar19 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar21 = BuilderArena::allocate(pBVar20,uVar9);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar19 = AVar21.words;
          pSVar7 = AVar21.segment;
          local_d8 = (WirePointer *)CONCAT44(local_d8._4_4_,(int)local_d8 + uVar14);
          *(int *)((long)&(pOVar13->tag).content + 4) = iVar3 * 8 + 7;
          *(int *)&pwVar19->content = (int)___end5 * 4;
          *(StructDataWordCount *)((long)&pwVar19->content + 4) = elementSize.data;
          *(short *)((long)&pwVar19->content + 6) = (short)local_f8;
          local_b8 = (WirePointer *)(pwVar19 + 1);
          if (oldSize == POINTER) {
            pWVar15 = local_b8 + ((uint)elementSize & 0xffff);
            uVar6 = ___end5 & 0xffffffff;
            pWVar16 = local_e0;
            while (iVar10 = (int)uVar6, uVar6 = (ulong)(iVar10 - 1), iVar10 != 0) {
              WireHelpers::transferPointer(pSVar7,pWVar15,this_00,pWVar16);
              pWVar16 = pWVar16 + 1;
              pWVar15 = (WirePointer *)
                        ((long)&(pWVar15->offsetAndKind).value + (ulong)(local_c8 * 8));
            }
          }
          else {
            uVar17 = (ulong)(uVar14 >> 3);
            pBVar20 = (BuilderArena *)((long)local_f0 - 6);
            uVar6 = ___end5 & 0xffffffff;
            pWVar15 = local_e0;
            pWVar16 = local_b8;
            local_f0 = pBVar20;
            while (iVar10 = (int)uVar6, uVar6 = (ulong)(iVar10 - 1), iVar10 != 0) {
              if (0xfffffffffffffffb < pBVar20) {
                memcpy(pWVar16,pWVar15,uVar17);
                pBVar20 = local_f0;
              }
              pWVar15 = (WirePointer *)((long)&(pWVar15->offsetAndKind).value + uVar17);
              pWVar16 = (WirePointer *)
                        ((long)&(pWVar16->offsetAndKind).value + (ulong)(local_c8 * 8));
            }
          }
          uVar6 = ___end5;
          uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_4_>
                            (((ulong)local_d8 & 0xffffffff) * ___end5 + 0x3f >> 6,
                             (anon_class_1_0_00000001 *)&_kjCondition);
          if ((int)uVar4 != 0) {
            memset(local_e0,0,(ulong)(uint)((int)uVar4 << 3));
          }
          goto LAB_0015128a;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [123])
                   "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
    }
    kj::_::Debug::Fault::~Fault(&f);
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  local_b8 = (WirePointer *)0x0;
LAB_00150aea:
  pOVar13 = (OrphanBuilder *)(local_b8 + -1);
  if (local_b8 == (WirePointer *)0x0) {
    pOVar13 = (OrphanBuilder *)0x0;
  }
  this->location = &pOVar13->tag;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}